

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varset.h
# Opt level: O1

VarSet * __thiscall
libDAI::VarSet::operator/(VarSet *__return_storage_ptr__,VarSet *this,VarSet *ns)

{
  pointer pVVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  pointer pVVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  
  (__return_storage_ptr__->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->_statespace = 1;
  std::
  __set_difference<__gnu_cxx::__normal_iterator<libDAI::Var_const*,std::vector<libDAI::Var,std::allocator<libDAI::Var>>>,__gnu_cxx::__normal_iterator<libDAI::Var_const*,std::vector<libDAI::Var,std::allocator<libDAI::Var>>>,std::insert_iterator<std::vector<libDAI::Var,std::allocator<libDAI::Var>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((this->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (ns->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
             super__Vector_impl_data._M_start,
             (ns->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
             super__Vector_impl_data._M_finish,__return_storage_ptr__,
             (__return_storage_ptr__->_vars).
             super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
             super__Vector_impl_data._M_start);
  __return_storage_ptr__->_statespace = 1;
  pVVar5 = (__return_storage_ptr__->_vars).
           super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar1 = (__return_storage_ptr__->_vars).
           super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pVVar5 != pVVar1) {
    lVar4 = -0x10 - (long)pVVar5;
    auVar10 = vpbroadcastq_avx512f();
    auVar10 = vpsrlq_avx512f(auVar10,4);
    auVar11 = vpbroadcastq_avx512f(ZEXT816(1));
    uVar6 = 0;
    auVar12 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    vpmovsxbd_avx2(ZEXT816(0x7060504030201000));
    do {
      auVar13 = vmovdqa64_avx512f(auVar11);
      auVar11 = vpbroadcastq_avx512f();
      auVar11 = vporq_avx512f(auVar11,auVar12);
      uVar3 = vpcmpuq_avx512f(auVar11,auVar10,2);
      auVar11 = vpgatherdq_avx512f(*(undefined4 *)((long)&pVVar5->_states + uVar6));
      auVar14._8_8_ = (ulong)((byte)(uVar3 >> 1) & 1) * auVar11._8_8_;
      auVar14._0_8_ = (ulong)((byte)uVar3 & 1) * auVar11._0_8_;
      auVar14._16_8_ = (ulong)((byte)(uVar3 >> 2) & 1) * auVar11._16_8_;
      auVar14._24_8_ = (ulong)((byte)(uVar3 >> 3) & 1) * auVar11._24_8_;
      auVar14._32_8_ = (ulong)((byte)(uVar3 >> 4) & 1) * auVar11._32_8_;
      auVar14._40_8_ = (ulong)((byte)(uVar3 >> 5) & 1) * auVar11._40_8_;
      auVar14._48_8_ = (ulong)((byte)(uVar3 >> 6) & 1) * auVar11._48_8_;
      auVar14._56_8_ = (uVar3 >> 7) * auVar11._56_8_;
      auVar11 = vpmullq_avx512dq(auVar14,auVar13);
      uVar6 = uVar6 + 8;
      pVVar5 = pVVar5 + 8;
    } while ((((ulong)((long)pVVar1 + lVar4) >> 4) + 8 & 0xfffffffffffffff8) != uVar6);
    auVar10 = vmovdqa64_avx512f(auVar11);
    bVar2 = (bool)((byte)uVar3 & 1);
    auVar11._0_8_ = (ulong)bVar2 * auVar10._0_8_ | (ulong)!bVar2 * auVar13._0_8_;
    bVar2 = (bool)((byte)(uVar3 >> 1) & 1);
    auVar11._8_8_ = (ulong)bVar2 * auVar10._8_8_ | (ulong)!bVar2 * auVar13._8_8_;
    bVar2 = (bool)((byte)(uVar3 >> 2) & 1);
    auVar11._16_8_ = (ulong)bVar2 * auVar10._16_8_ | (ulong)!bVar2 * auVar13._16_8_;
    bVar2 = (bool)((byte)(uVar3 >> 3) & 1);
    auVar11._24_8_ = (ulong)bVar2 * auVar10._24_8_ | (ulong)!bVar2 * auVar13._24_8_;
    bVar2 = (bool)((byte)(uVar3 >> 4) & 1);
    auVar11._32_8_ = (ulong)bVar2 * auVar10._32_8_ | (ulong)!bVar2 * auVar13._32_8_;
    bVar2 = (bool)((byte)(uVar3 >> 5) & 1);
    auVar11._40_8_ = (ulong)bVar2 * auVar10._40_8_ | (ulong)!bVar2 * auVar13._40_8_;
    bVar2 = (bool)((byte)(uVar3 >> 6) & 1);
    auVar11._48_8_ = (ulong)bVar2 * auVar10._48_8_ | (ulong)!bVar2 * auVar13._48_8_;
    auVar11._56_8_ = (uVar3 >> 7) * auVar10._56_8_ | (ulong)!SUB81(uVar3 >> 7,0) * auVar13._56_8_;
    auVar9 = vextracti64x4_avx512f(auVar11,1);
    auVar10 = vpmullq_avx512dq(auVar11,ZEXT3264(auVar9));
    auVar7 = vpmullq_avx512vl(auVar10._0_16_,auVar10._16_16_);
    auVar8 = vpshufd_avx(auVar7,0xee);
    auVar8 = vpmullq_avx512vl(auVar7,auVar8);
    __return_storage_ptr__->_statespace = auVar8._0_8_;
  }
  return __return_storage_ptr__;
}

Assistant:

VarSet operator/ (const VarSet& ns) const {
                VarSet res;
                std::set_difference( _vars.begin(), _vars.end(), ns._vars.begin(), ns._vars.end(), inserter( res._vars, res._vars.begin() ) );
                res.calcStateSpace();
#ifdef DEBUG
                assert( is_sorted( res._vars.begin(), res._vars.end() ) );
#endif
                return res;
            }